

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_cfi_stackSizeAdvance(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc,size_t increment)

{
  size_t increment_local;
  size_t pc_local;
  sysbvm_dwarf_cfi_builder_t *cfi_local;
  
  if ((((cfi->isInPrologue & 1U) != 0) && (increment != 0)) &&
     (cfi->stackFrameSize = (increment >> 3) + cfi->stackFrameSize,
     (cfi->hasFramePointerRegister & 1U) == 0)) {
    sysbvm_dwarf_cfi_setPC(cfi,pc);
    sysbvm_dwarf_cfi_cfaInRegisterWithFactoredOffset
              (cfi,cfi->stackPointerRegister,cfi->stackFrameSizeAtFramePointer);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_stackSizeAdvance(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc, size_t increment)
{
    if(!cfi->isInPrologue) return;
    if(!increment) return;
    
    cfi->stackFrameSize += increment / sizeof(uintptr_t);
    if(!cfi->hasFramePointerRegister)
    {
        sysbvm_dwarf_cfi_setPC(cfi, pc);
        sysbvm_dwarf_cfi_cfaInRegisterWithFactoredOffset(cfi, cfi->stackPointerRegister, cfi->stackFrameSizeAtFramePointer);
    }
}